

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O1

TextureGatherCase *
deqp::gles31::Functional::anon_unknown_0::makeTextureGatherCase
          (TextureType textureType,Context *context,char *name,char *description,
          GatherType gatherType,OffsetSize offsetSize,TextureFormat textureFormat,
          CompareMode shadowCompareMode,WrapMode wrapS,WrapMode wrapT,
          MaybeTextureSwizzle *texSwizzle,FilterMode minFilter,FilterMode magFilter,int baseLevel,
          IVec3 *textureSize,deUint32 flags)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 *puVar3;
  TextureGatherCase *this;
  TextureFormat *pTVar4;
  undefined4 in_register_0000008c;
  undefined4 in_stack_00000044;
  deUint32 dVar5;
  TextureFormat local_40;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_0000008c,offsetSize);
  puVar3 = (undefined4 *)CONCAT44(in_stack_00000044,baseLevel);
  if (textureType == TEXTURETYPE_2D_ARRAY) {
    dVar5 = 0x164b01e;
    this = (TextureGatherCase *)operator_new(400);
    TextureGatherCase::TextureGatherCase
              (this,context,name,(char *)0x2,(TextureType)description,gatherType,offsetSize,
               (TextureFormat)((ulong)textureFormat & 0xffffffff),shadowCompareMode,wrapS,wrapT,
               (MaybeTextureSwizzle *)((ulong)texSwizzle & 0xffffffff),minFilter,magFilter,
               (int)textureSize,dVar5);
    (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TextureGather2DArrayCase_021ac128;
    this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
         *(_func_int ***)CONCAT44(in_stack_00000044,baseLevel);
    *(undefined4 *)&this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx =
         *(undefined4 *)((undefined8 *)CONCAT44(in_stack_00000044,baseLevel) + 1);
    this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
    local_40.order = CHANNELORDER_LAST;
    local_40.type = CHANNELTYPE_LAST;
    tcu::Texture2DArray::Texture2DArray
              ((Texture2DArray *)
               &this[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2,&local_40,1,1,1)
    ;
    pTVar4 = (TextureFormat *)&this[1].m_gatherType;
  }
  else if (textureType == TEXTURETYPE_CUBE) {
    dVar5 = 0x164af5c;
    this = (TextureGatherCase *)operator_new(0x298);
    uVar1 = *puVar3;
    TextureGatherCase::TextureGatherCase
              (this,context,name,&DAT_00000001,TEXTURETYPE_2D,GATHERTYPE_BASIC,offsetSize,
               (TextureFormat)((ulong)textureFormat & 0xffffffff),shadowCompareMode,wrapS,wrapT,
               (MaybeTextureSwizzle *)((ulong)texSwizzle & 0xffffffff),minFilter,magFilter,
               (int)textureSize,dVar5);
    (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TextureGatherCubeCase_021ac1a8;
    *(undefined4 *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = uVar1;
    this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
    local_40.order = CHANNELORDER_LAST;
    local_40.type = CHANNELTYPE_LAST;
    tcu::TextureCube::TextureCube
              ((TextureCube *)
               &this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length,
               &local_40,1);
    pTVar4 = &this[2].m_textureFormat;
  }
  else {
    if (textureType != TEXTURETYPE_2D) {
      return (TextureGatherCase *)0x0;
    }
    dVar5 = 0x164ae84;
    this = (TextureGatherCase *)operator_new(0x180);
    uVar1 = *puVar3;
    uVar2 = puVar3[1];
    TextureGatherCase::TextureGatherCase
              (this,context,name,(char *)0x0,(TextureType)description,gatherType,
               (OffsetSize)local_38,(TextureFormat)((ulong)textureFormat & 0xffffffff),
               shadowCompareMode,wrapS,wrapT,(MaybeTextureSwizzle *)((ulong)texSwizzle & 0xffffffff)
               ,minFilter,magFilter,(int)textureSize,dVar5);
    (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TextureGather2DCase_021abf18;
    *(undefined4 *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = uVar1;
    *(undefined4 *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
         = uVar2;
    this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
    local_40.order = CHANNELORDER_LAST;
    local_40.type = CHANNELTYPE_LAST;
    tcu::Texture2D::Texture2D
              ((Texture2D *)
               &this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length,
               &local_40,1,1);
    pTVar4 = (TextureFormat *)
             ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_children.
                     super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                     super__Vector_impl_data + 0x10);
  }
  pTVar4->order = R;
  pTVar4->type = SNORM_INT8;
  pTVar4[1].order = R;
  pTVar4[1].type = SNORM_INT8;
  pTVar4[2].order = R;
  pTVar4[2].type = SNORM_INT8;
  return this;
}

Assistant:

static inline TextureGatherCase* makeTextureGatherCase (TextureType					textureType,
														Context&					context,
														const char*					name,
														const char*					description,
														GatherType					gatherType,
														OffsetSize					offsetSize,
														tcu::TextureFormat			textureFormat,
														tcu::Sampler::CompareMode	shadowCompareMode,
														tcu::Sampler::WrapMode		wrapS,
														tcu::Sampler::WrapMode		wrapT,
														const MaybeTextureSwizzle&	texSwizzle,
														tcu::Sampler::FilterMode	minFilter,
														tcu::Sampler::FilterMode	magFilter,
														int							baseLevel,
														const IVec3&				textureSize,
														deUint32					flags = 0)
{
	switch (textureType)
	{
		case TEXTURETYPE_2D:
			return new TextureGather2DCase(context, name, description, gatherType, offsetSize, textureFormat, shadowCompareMode,
										   wrapS, wrapT, texSwizzle, minFilter, magFilter, baseLevel, flags, textureSize.swizzle(0, 1));

		case TEXTURETYPE_2D_ARRAY:
			return new TextureGather2DArrayCase(context, name, description, gatherType, offsetSize, textureFormat, shadowCompareMode,
												wrapS, wrapT, texSwizzle, minFilter, magFilter, baseLevel, flags, textureSize);

		case TEXTURETYPE_CUBE:
			DE_ASSERT(gatherType == GATHERTYPE_BASIC);
			DE_ASSERT(offsetSize == OFFSETSIZE_NONE);
			return new TextureGatherCubeCase(context, name, description, textureFormat, shadowCompareMode,
											 wrapS, wrapT, texSwizzle, minFilter, magFilter, baseLevel, flags, textureSize.x());

		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}